

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::Parser::parse_in_place(Parser *this,csubstr file,substr buf,Tree *t,size_t node_id)

{
  bool bVar1;
  char *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  Parser *in_RDI;
  size_t in_R8;
  Tree *in_R9;
  Parser *in_stack_00000050;
  Parser *in_stack_00000078;
  Parser *in_stack_00000080;
  Parser *in_stack_00000100;
  
  (in_RDI->m_file).str = in_RSI;
  (in_RDI->m_file).len = in_RDX;
  (in_RDI->m_buf).str = in_RCX;
  (in_RDI->m_buf).len = in_R8;
  in_RDI->m_root_id = (size_t)t;
  in_RDI->m_tree = in_R9;
  _reset(in_stack_00000100);
  while (bVar1 = _finished_file(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    _scan_line(in_stack_00000050);
    while (bVar1 = _finished_line(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
      _handle_line(in_stack_00000078);
    }
    bVar1 = _finished_file(in_RDI);
    if (bVar1) break;
    _line_ended(in_stack_00000080);
  }
  _handle_finished_file((Parser *)0x2f52c6);
  return;
}

Assistant:

void Parser::parse_in_place(csubstr file, substr buf, Tree *t, size_t node_id)
{
    m_file = file;
    m_buf = buf;
    m_root_id = node_id;
    m_tree = t;
    _reset();
    while( ! _finished_file())
    {
        _scan_line();
        while( ! _finished_line())
            _handle_line();
        if(_finished_file())
            break; // it may have finished because of multiline blocks
        _line_ended();
    }
    _handle_finished_file();
}